

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_index_load_offsets(CFF_Index idx)

{
  byte bVar1;
  FT_Stream stream_00;
  FT_Memory memory_00;
  FT_ULong count;
  FT_ULong *pFVar2;
  uchar *puVar3;
  ulong *local_50;
  FT_ULong *poff;
  FT_Byte *p_end;
  FT_Byte *p;
  FT_ULong data_size;
  FT_Byte offsize;
  FT_Memory memory;
  FT_Stream stream;
  CFF_Index pCStack_10;
  FT_Error error;
  CFF_Index idx_local;
  
  stream._4_4_ = 0;
  stream_00 = idx->stream;
  memory_00 = stream_00->memory;
  pCStack_10 = idx;
  if ((idx->count != 0) && (idx->offsets == (FT_ULong *)0x0)) {
    bVar1 = idx->off_size;
    count = (ulong)(idx->count + 1) * (ulong)bVar1;
    pFVar2 = (FT_ULong *)
             ft_mem_realloc(memory_00,8,0,(ulong)(idx->count + 1),(void *)0x0,
                            (FT_Error *)((long)&stream + 4));
    pCStack_10->offsets = pFVar2;
    if ((stream._4_4_ == 0) &&
       ((stream._4_4_ = FT_Stream_Seek(stream_00,pCStack_10->start + (ulong)pCStack_10->hdr_size),
        stream._4_4_ == 0 &&
        (stream._4_4_ = FT_Stream_EnterFrame(stream_00,count), stream._4_4_ == 0)))) {
      local_50 = pCStack_10->offsets;
      p_end = stream_00->cursor;
      puVar3 = p_end + count;
      if (bVar1 == 1) {
        for (; p_end < puVar3; p_end = p_end + 1) {
          *local_50 = (ulong)*p_end;
          local_50 = local_50 + 1;
        }
      }
      else if (bVar1 == 2) {
        for (; p_end < puVar3; p_end = p_end + 2) {
          *local_50 = (ulong)CONCAT11(*p_end,p_end[1]);
          local_50 = local_50 + 1;
        }
      }
      else if (bVar1 == 3) {
        for (; p_end < puVar3; p_end = p_end + 3) {
          *local_50 = (ulong)((uint)*p_end << 0x10 | (uint)p_end[1] << 8 | (uint)p_end[2]);
          local_50 = local_50 + 1;
        }
      }
      else {
        for (; p_end < puVar3; p_end = p_end + 4) {
          *local_50 = (ulong)((uint)*p_end << 0x18 | (uint)p_end[1] << 0x10 | (uint)p_end[2] << 8 |
                             (uint)p_end[3]);
          local_50 = local_50 + 1;
        }
      }
      FT_Stream_ExitFrame(stream_00);
    }
  }
  if (stream._4_4_ != 0) {
    ft_mem_free(memory_00,pCStack_10->offsets);
    pCStack_10->offsets = (FT_ULong *)0x0;
  }
  return stream._4_4_;
}

Assistant:

static FT_Error
  cff_index_load_offsets( CFF_Index  idx )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Stream  stream = idx->stream;
    FT_Memory  memory = stream->memory;


    if ( idx->count > 0 && !idx->offsets )
    {
      FT_Byte    offsize = idx->off_size;
      FT_ULong   data_size;
      FT_Byte*   p;
      FT_Byte*   p_end;
      FT_ULong*  poff;


      data_size = (FT_ULong)( idx->count + 1 ) * offsize;

      if ( FT_NEW_ARRAY( idx->offsets, idx->count + 1 ) ||
           FT_STREAM_SEEK( idx->start + idx->hdr_size ) ||
           FT_FRAME_ENTER( data_size )                  )
        goto Exit;

      poff   = idx->offsets;
      p      = (FT_Byte*)stream->cursor;
      p_end  = p + data_size;

      switch ( offsize )
      {
      case 1:
        for ( ; p < p_end; p++, poff++ )
          poff[0] = p[0];
        break;

      case 2:
        for ( ; p < p_end; p += 2, poff++ )
          poff[0] = FT_PEEK_USHORT( p );
        break;

      case 3:
        for ( ; p < p_end; p += 3, poff++ )
          poff[0] = FT_PEEK_UOFF3( p );
        break;

      default:
        for ( ; p < p_end; p += 4, poff++ )
          poff[0] = FT_PEEK_ULONG( p );
      }

      FT_FRAME_EXIT();
    }

  Exit:
    if ( error )
      FT_FREE( idx->offsets );

    return error;
  }